

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O1

void __thiscall helics::apps::App::App(App *this,string_view appName,FederateInfo *fedInfo)

{
  element_type *peVar1;
  undefined1 local_59 [9];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = appName._M_str;
  local_40._M_len = appName._M_len;
  this->_vptr_App = (_func_int **)&PTR__App_005597d8;
  (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48 = &(this->fed).
              super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::CombinationFederate,std::allocator<helics::CombinationFederate>,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo_const&>
            (local_48,(CombinationFederate **)&this->fed,
             (allocator<helics::CombinationFederate> *)local_59,&local_40,fedInfo);
  (this->stopTime).internalTimeCode = 0x7fffffffffffffff;
  (this->configFileName)._M_dataplus._M_p = (pointer)&(this->configFileName).field_2;
  (this->configFileName)._M_string_length = 0;
  (this->configFileName).field_2._M_local_buf[0] = '\0';
  (this->inputFileName)._M_dataplus._M_p = (pointer)&(this->inputFileName).field_2;
  (this->inputFileName)._M_string_length = 0;
  (this->inputFileName).field_2._M_local_buf[0] = '\0';
  (this->outFileName)._M_dataplus._M_p = (pointer)&(this->outFileName).field_2;
  (this->outFileName)._M_string_length = 0;
  (this->outFileName).field_2._M_local_buf[0] = '\0';
  local_50 = &this->remArgs;
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->helpMode = false;
  this->useLocal = false;
  this->fileLoaded = false;
  this->deactivated = false;
  this->quietMode = false;
  peVar1 = (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->configFileName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&(peVar1->super_ValueFederate).field_0x38 +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]));
  return;
}

Assistant:

App::App(std::string_view appName, const FederateInfo& fedInfo):
    fed(std::make_shared<CombinationFederate>(appName, fedInfo))
{
    configFileName = fed->getConfigFile();
}